

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
PathEqualNode::Evaluate
          (string *__return_storage_ptr__,PathEqualNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  const_reference pvVar2;
  char *local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmCMakePath local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  cmCMakePath local_60;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *param_3_local;
  cmGeneratorExpressionContext *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  PathEqualNode *this_local;
  
  local_38 = param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)param_3;
  param_3_local = (GeneratorExpressionContent *)param_2;
  param_2_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (PathEqualNode *)__return_storage_ptr__;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](parameters,0);
  std::__cxx11::string::string((string *)&local_80,(string *)pvVar2);
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&local_60,&local_80,generic_format);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,1);
  std::__cxx11::string::string((string *)&local_d8,(string *)pvVar2);
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&local_b8,&local_d8,generic_format);
  bVar1 = ::operator==(&local_60,&local_b8);
  if (bVar1) {
    local_100 = "1";
  }
  else {
    local_100 = "0";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_100,&local_d9);
  std::allocator<char>::~allocator(&local_d9);
  cmCMakePath::~cmCMakePath(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmCMakePath::~cmCMakePath(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* /*context*/,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    return cmCMakePath{ parameters[0] } == cmCMakePath{ parameters[1] } ? "1"
                                                                        : "0";
  }